

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeader(char *label)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiWindow *this;
  ImGuiTable *pIVar5;
  ImDrawList *draw_list;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  ImGuiID id;
  ImU32 IVar10;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar11;
  ImGuiTableColumn *column;
  ImGuiTableColumnIdx IVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  ImVec2 IVar18;
  ImVec2 pos;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_112;
  bool local_111;
  float local_110;
  char local_10c [4];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  char *local_c8;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [24];
  long local_a0;
  undefined1 local_98 [16];
  char *local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImRect local_58;
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb_00;
  
  local_108._8_8_ = local_108._0_8_;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return;
  }
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = GImGui;
  pIVar5 = GImGui->CurrentTable;
  iVar13 = pIVar5->CurrentColumn;
  lVar14 = (long)iVar13;
  column = (pIVar5->Columns).Data + lVar14;
  pcVar15 = "";
  if (label != (char *)0x0) {
    pcVar15 = label;
  }
  local_88 = FindRenderedTextEnd(pcVar15,(char *)0x0);
  local_c8 = pcVar15;
  local_78 = CalcTextSize(pcVar15,local_88,true,-1.0);
  auVar26._8_4_ = (int)extraout_XMM0_Qb;
  auVar26._0_4_ = local_78.x;
  auVar26._4_4_ = local_78.y;
  auVar26._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_80 = (this->DC).CursorPos;
  pIVar11 = (pIVar5->Columns).Data;
  fVar21 = pIVar11[lVar14].MinX;
  fVar1 = pIVar11[lVar14].MaxX;
  fVar2 = (pIVar5->WorkRect).Min.x;
  uVar16 = -(uint)(fVar2 <= fVar21);
  local_e8 = ZEXT416(~uVar16 & (uint)fVar2 | (uint)fVar21 & uVar16);
  fVar21 = (pIVar5->WorkRect).Max.x;
  if (fVar21 <= fVar1) {
    fVar1 = fVar21;
  }
  local_d8 = ZEXT416((uint)fVar1);
  local_110 = pIVar5->RowPosY1;
  local_48 = ZEXT416((uint)pIVar5->RowPosY2);
  fVar21 = pIVar5->RowMinHeight - (pIVar5->CellPaddingY + pIVar5->CellPaddingY);
  uVar16 = -(uint)(fVar21 <= local_78.y);
  local_68 = ZEXT416(~uVar16 & (uint)fVar21 | (uint)local_78.y & uVar16);
  local_10c[0] = '\0';
  local_10c[1] = '\0';
  local_10c[2] = '\0';
  local_10c[3] = '\0';
  local_108._0_4_ = local_80.x;
  local_108._4_4_ = local_80.y;
  fVar21 = local_80.x;
  auVar20 = ZEXT816(0);
  uVar7 = local_f8._0_8_;
  IVar18 = local_78;
  if (((pIVar5->Flags & 8) == 0) || ((column->Flags & 0x200) != 0)) {
    local_98._12_4_ = 0;
    local_98._8_4_ = 0;
    local_98._4_4_ = 0;
    local_98._0_4_ = 0.0;
  }
  else {
    local_98._0_4_ =
         (undefined4)
         (int)(*(float *)(local_f8._0_8_ + 0x3c18) * 0.65 + *(float *)(local_f8._0_8_ + 0x3834));
    local_98._4_4_ = 0;
    local_98._8_4_ = 0;
    local_98._12_4_ = 0;
    if ('\0' < column->SortOrder) {
      local_98 = ZEXT416((uint)local_98._0_4_);
      local_bc = fVar21;
      local_b8._0_16_ = auVar26;
      ImFormatString(local_10c,4,"%d");
      local_c0 = *(float *)(uVar7 + 0x384c);
      auVar19._0_8_ = CalcTextSize(local_10c,(char *)0x0,false,-1.0);
      auVar19._8_8_ = extraout_XMM0_Qb_00;
      auVar20._4_12_ = auVar19._4_12_;
      auVar20._0_4_ = auVar19._0_4_ + local_c0;
      fVar21 = local_bc;
      IVar18 = (ImVec2)local_b8._0_8_;
    }
  }
  fVar21 = IVar18.x + fVar21 + auVar20._0_4_ + (float)local_98._0_4_;
  uVar3 = column->ContentMaxXHeadersUsed;
  uVar4 = column->ContentMaxXHeadersIdeal;
  uVar16 = -(uint)(column->WorkMaxX <= (float)uVar3);
  uVar17 = -(uint)(fVar21 <= (float)uVar4);
  uVar25 = CONCAT44(~uVar17 & (uint)fVar21,~uVar16 & (uint)column->WorkMaxX) |
           CONCAT44(uVar4 & uVar17,uVar3 & uVar16);
  column->ContentMaxXHeadersUsed = (float)(int)uVar25;
  column->ContentMaxXHeadersIdeal = (float)(int)(uVar25 >> 0x20);
  if ((pIVar5->IsContextPopupOpen == true) && (iVar13 == pIVar5->ContextPopupColumn)) {
    local_b8[1] = (char)((ushort)pIVar5->InstanceInteracted >> 8);
    local_b8[0] = pIVar5->InstanceInteracted == pIVar5->InstanceCurrent;
    local_b8._2_2_ = 0;
  }
  else {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = local_b8._4_12_;
    local_b8._0_16_ = auVar6 << 0x20;
  }
  local_f8 = auVar20;
  local_a0 = lVar14;
  id = ImGuiWindow::GetID(this,local_c8,(char *)0x0);
  fVar21 = *(float *)(uVar7 + 0x3858) + *(float *)(uVar7 + 0x3858) +
           local_110 + (float)local_68._0_4_;
  uVar16 = -(uint)(fVar21 <= (float)local_48._0_4_);
  local_58.Max.y = (float)(uVar16 & local_48._0_4_ | ~uVar16 & (uint)fVar21);
  local_58.Min.x = (float)local_e8._0_4_;
  local_58.Min.y = local_110;
  local_58.Max.x = (float)local_d8._0_4_;
  local_70.x = 0.0;
  local_70.y = (float)local_68._0_4_;
  ItemSize(&local_70,-1.0);
  bVar8 = ItemAdd(&local_58,id,(ImRect *)0x0,0);
  if (!bVar8) {
    return;
  }
  cVar9 = ButtonBehavior(&local_58,id,&local_111,&local_112,0x1000);
  if (*(ImGuiID *)(uVar7 + 0x3ef4) != id) {
    SetItemAllowOverlap();
  }
  local_108._0_8_ = (ulong)local_108._0_8_ >> 0x20;
  if (((local_112 | local_111 | local_b8[0]) & 1) == 0) {
    uVar16 = 0x2a;
    if ((pIVar5->field_0x98 & 1) != 0) goto LAB_001556d3;
  }
  else {
    uVar16 = 0x1a;
    if (local_112 == false) {
      uVar16 = local_111 & 1 | 0x18;
    }
  }
  IVar10 = GetColorU32(uVar16,1.0);
  TableSetBgColor(3,IVar10,pIVar5->CurrentColumn);
LAB_001556d3:
  RenderNavHighlight(&local_58,id,10);
  lVar14 = local_a0;
  if (local_112 == false) {
    (this->DC).CursorPos.y = *(float *)(uVar7 + 0x3848) * -0.5 + (this->DC).CursorPos.y;
  }
  else {
    IVar12 = (ImGuiTableColumnIdx)local_a0;
    pIVar5->HeldHeaderColumn = IVar12;
    (this->DC).CursorPos.y = *(float *)(uVar7 + 0x3848) * -0.5 + (this->DC).CursorPos.y;
    if ((pIVar5->Flags & 2) != 0) {
      bVar8 = IsMouseDragging(0,-1.0);
      if ((bVar8) && (*(char *)(uVar7 + 0x424c) == '\0')) {
        pIVar5->ReorderColumn = IVar12;
        pIVar5->InstanceInteracted = pIVar5->InstanceCurrent;
        fVar21 = *(float *)(uVar7 + 0xf0);
        if (((fVar21 < 0.0) &&
            (((*(float *)(uVar7 + 0xd94) <= (float)local_e8._0_4_ &&
               (float)local_e8._0_4_ != *(float *)(uVar7 + 0xd94) &&
              ((long)column->PrevEnabledColumn != -1)) &&
             (pIVar11 = (pIVar5->Columns).Data, pIVar11 != (ImGuiTableColumn *)0x0)))) &&
           ((pIVar11 = pIVar11 + column->PrevEnabledColumn,
            ((pIVar11->Flags | column->Flags) & 0x40U) == 0 &&
            (column->IndexWithinEnabledSet < pIVar5->FreezeColumnsRequest !=
             pIVar5->FreezeColumnsRequest <= pIVar11->IndexWithinEnabledSet)))) {
          pIVar5->ReorderColumnDir = -1;
        }
        if (((0.0 < fVar21) && ((float)local_d8._0_4_ < *(float *)(uVar7 + 0xd94))) &&
           (((long)column->NextEnabledColumn != -1 &&
            (((pIVar11 = (pIVar5->Columns).Data, pIVar11 != (ImGuiTableColumn *)0x0 &&
              (pIVar11 = pIVar11 + column->NextEnabledColumn,
              ((pIVar11->Flags | column->Flags) & 0x40U) == 0)) &&
             (column->IndexWithinEnabledSet < pIVar5->FreezeColumnsRequest !=
              pIVar5->FreezeColumnsRequest <= pIVar11->IndexWithinEnabledSet)))))) {
          pIVar5->ReorderColumnDir = '\x01';
        }
      }
    }
  }
  iVar13 = (int)lVar14;
  local_d8._0_4_ = ((float)local_d8._0_4_ - (float)local_98._0_4_) - (float)local_f8._0_4_;
  fVar21 = (float)local_108._0_4_;
  if (((pIVar5->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
    uVar22 = 0;
    uVar23 = 0;
    uVar24 = 0;
    if (column->SortOrder != -1) {
      local_108 = ZEXT416((uint)local_108._0_4_);
      local_110 = (float)CONCAT31(local_110._1_3_,cVar9);
      local_e8._4_4_ = local_d8._4_4_ & local_e8._4_4_;
      local_e8._0_4_ =
           ~-(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_d8._0_4_ |
           -(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_e8._0_4_;
      local_e8._8_4_ = local_d8._8_4_ & local_e8._8_4_;
      local_e8._12_4_ = local_d8._12_4_ & local_e8._12_4_;
      if ('\0' < column->SortOrder) {
        IVar10 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar10);
        IVar18.x = *(float *)(uVar7 + 0x384c) + (float)local_e8._0_4_;
        IVar18.y = (float)local_108._0_4_;
        RenderText(IVar18,local_10c,(char *)0x0,true);
        PopStyleColor(1);
        local_e8._0_4_ = (float)local_e8._0_4_ + (float)local_f8._0_4_;
      }
      draw_list = this->DrawList;
      IVar10 = GetColorU32(0,1.0);
      pos.y = (float)local_108._0_4_;
      pos.x = (float)local_e8._0_4_;
      RenderArrow(draw_list,pos,IVar10,(column->field_0x65 & 3) == 1 ^ 3,0.65);
      uVar22 = local_108._4_4_;
      uVar23 = local_108._8_4_;
      uVar24 = local_108._12_4_;
      cVar9 = local_110._0_1_;
    }
    fVar21 = (float)local_108._0_4_;
    if ((cVar9 != '\0') && (iVar13 != pIVar5->ReorderColumn)) {
      local_108._4_4_ = uVar22;
      local_108._8_4_ = uVar23;
      local_108._12_4_ = uVar24;
      sort_direction = TableGetColumnNextSortDirection(column);
      TableSetColumnSortDirection(iVar13,sort_direction,*(bool *)(uVar7 + 0xdad));
      fVar21 = (float)local_108._0_4_;
    }
  }
  pcVar15 = local_88;
  local_70.y = (float)local_68._0_4_ + fVar21 + *(float *)(uVar7 + 0x3838);
  local_70.x = (float)local_d8._0_4_;
  RenderTextEllipsis(this->DrawList,&local_80,&local_70,(float)local_d8._0_4_,(float)local_d8._0_4_,
                     local_c8,local_88,&local_78);
  if ((((float)local_d8._0_4_ - local_80.x < local_78.x) && (local_111 == true)) &&
     (*(float *)(uVar7 + 0x5330) <= *(float *)(uVar7 + 0x3ef0) &&
      *(float *)(uVar7 + 0x3ef0) != *(float *)(uVar7 + 0x5330))) {
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)local_c8));
  }
  bVar8 = IsMouseReleased(1);
  if ((bVar8) && (bVar8 = IsItemHovered(0), bVar8)) {
    TableOpenContextMenu(iVar13);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}